

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

int set_double_attr(attr_list list,atom_t attr_id,double dvalue)

{
  attr_union value;
  int iVar1;
  undefined8 in_XMM0_Qa;
  attr_union tmp;
  attr_value_type t;
  attr_list in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd8;
  
  value.u.o.buffer = (void *)in_stack_ffffffffffffffd8;
  value.u.d = (double)in_XMM0_Qa;
  iVar1 = set_pattr(in_stack_ffffffffffffffc8,0,0x1058ab,value);
  return iVar1;
}

Assistant:

extern int
set_double_attr(attr_list list, atom_t attr_id, double dvalue)
{
    attr_value_type t = Attr_Float4;
    attr_union tmp;
    tmp.u.d = dvalue;
    if (sizeof(double) == 8) t = Attr_Float8;
    if (sizeof(double) == 16) t = Attr_Float16;
    return set_pattr(list, attr_id, t, tmp);
}